

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

void vkt::compute::anon_unknown_0::EmptyShaderTest::createProgram(SourceCollections *dst)

{
  ProgramSources *this;
  allocator<char> local_91;
  string local_90;
  ShaderSource local_70;
  allocator<char> local_31;
  string local_30;
  SourceCollections *local_10;
  SourceCollections *dst_local;
  
  local_10 = dst;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"comp",&local_31);
  this = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "#version 310 es\nlayout (local_size_x = 1) in;\nvoid main (void) {}\n",&local_91);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_70,&local_90);
  glu::ProgramSources::operator<<(this,&local_70);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void createProgram (SourceCollections& dst)
{
	dst.glslSources.add("comp") << glu::ComputeSource(
		"#version 310 es\n"
		"layout (local_size_x = 1) in;\n"
		"void main (void) {}\n"
	);
}